

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O3

void ngx_chain_update_chains
               (ngx_pool_t *p,ngx_chain_t **free,ngx_chain_t **busy,ngx_chain_t **out,
               ngx_buf_tag_t tag)

{
  ngx_buf_t *pnVar1;
  ngx_chain_t *pnVar2;
  long lVar3;
  ngx_chain_t **ppnVar4;
  ngx_chain_t *pnVar5;
  
  if (*out != (ngx_chain_t *)0x0) {
    ppnVar4 = busy;
    pnVar2 = *busy;
    if (*busy != (ngx_chain_t *)0x0) {
      do {
        pnVar5 = pnVar2;
        pnVar2 = pnVar5->next;
      } while (pnVar2 != (ngx_chain_t *)0x0);
      ppnVar4 = &pnVar5->next;
    }
    *ppnVar4 = *out;
    *out = (ngx_chain_t *)0x0;
  }
  pnVar2 = *busy;
  if (pnVar2 != (ngx_chain_t *)0x0) {
    do {
      pnVar1 = pnVar2->buf;
      if ((pnVar1->field_0x48 & 7) == 0) {
        lVar3 = pnVar1->file_last - pnVar1->file_pos;
      }
      else {
        lVar3 = (long)pnVar1->last - (long)pnVar1->pos;
      }
      if (lVar3 != 0) {
        return;
      }
      ppnVar4 = &p->chain;
      if (pnVar1->tag == tag) {
        pnVar1->pos = pnVar1->start;
        pnVar1->last = pnVar1->start;
        ppnVar4 = free;
      }
      *busy = pnVar2->next;
      pnVar2->next = *ppnVar4;
      *ppnVar4 = pnVar2;
      pnVar2 = *busy;
    } while (pnVar2 != (ngx_chain_t *)0x0);
  }
  return;
}

Assistant:

void
ngx_chain_update_chains(ngx_pool_t *p, ngx_chain_t **free, ngx_chain_t **busy,
    ngx_chain_t **out, ngx_buf_tag_t tag)
{
    ngx_chain_t  *cl;

    if (*out) {
        if (*busy == NULL) {
            *busy = *out;

        } else {
            for (cl = *busy; cl->next; cl = cl->next) { /* void */ }

            cl->next = *out;
        }

        *out = NULL;
    }

    while (*busy) {
        cl = *busy;

        if (ngx_buf_size(cl->buf) != 0) {
            break;
        }

        if (cl->buf->tag != tag) {
            *busy = cl->next;
            ngx_free_chain(p, cl);
            continue;
        }

        cl->buf->pos = cl->buf->start;
        cl->buf->last = cl->buf->start;

        *busy = cl->next;
        cl->next = *free;
        *free = cl;
    }
}